

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::RccListInputs
          (cmQtAutoGenInitializer *this,string *fileName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  streambuf *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_558;
  string local_538;
  string local_518 [32];
  ostringstream local_4f8 [8];
  ostringstream osst;
  long local_380;
  ifstream ifs;
  undefined1 local_178 [8];
  string qrcContents;
  string local_150;
  rep_conflict local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator local_108;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string rccStdOut;
  int retVal;
  bool result;
  string fileNameName;
  string fileDir;
  string local_50;
  string *local_30;
  string *error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *fileName_local;
  cmQtAutoGenInitializer *this_local;
  
  local_30 = error;
  error_local = (string *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)fileName;
  fileName_local = (string *)this;
  bVar1 = cmsys::SystemTools::FileExists(fileName);
  if (bVar1) {
    if ((((this->Rcc).super_GenVarsT.ExecutableExists & 1U) == 0) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&(this->Rcc).ListOptions), bVar1)) {
      std::__cxx11::string::string((string *)local_178);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_380,pcVar3,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_380 + *(long *)(local_380 + -0x18)));
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_4f8);
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_4f8,psVar4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)local_178,local_518);
        std::__cxx11::string::~string(local_518);
        std::__cxx11::ostringstream::~ostringstream(local_4f8);
      }
      else {
        std::__cxx11::string::operator=((string *)local_30,"rcc file not readable:\n  ");
        cmQtAutoGen::Quoted(&local_538,(string *)files_local);
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_538);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::operator+=((string *)local_30,"\n");
        this_local._7_1_ = 0;
      }
      qrcContents.field_2._13_3_ = 0;
      qrcContents.field_2._M_local_buf[0xc] = !bVar1;
      std::ifstream::~ifstream(&local_380);
      if (qrcContents.field_2._12_4_ == 0) {
        cmQtAutoGen::RccListParseContent
                  ((string *)local_178,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)error_local);
        qrcContents.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_178);
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_30,"rcc executable not available");
        this_local._7_1_ = 0;
        goto LAB_00511bea;
      }
      cmsys::SystemTools::GetFilenamePath
                ((string *)((long)&fileNameName.field_2 + 8),(string *)files_local);
      cmsys::SystemTools::GetFilenameName((string *)&retVal,(string *)files_local);
      rccStdOut.field_2._M_local_buf[0xf] = '\0';
      rccStdOut.field_2._8_4_ = 0;
      std::__cxx11::string::string((string *)(rccStdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100,&(this->Rcc).super_GenVarsT.Executable);
      local_110._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_108,&local_110);
      this_00 = &(this->Rcc).ListOptions;
      local_118._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_00);
      local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_100,local_108,local_118,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100,(value_type *)&retVal);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_130 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      rccStdOut.field_2._M_local_buf[0xf] =
           cmSystemTools::RunSingleCommand
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_100,(string *)((long)&rccStdErr.field_2 + 8),
                      (string *)
                      &cmd.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (int *)(rccStdOut.field_2._M_local_buf + 8),pcVar3,OUTPUT_NONE,
                      (cmDuration)local_130,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (((rccStdOut.field_2._M_local_buf[0xf] & 1U) == 0) || (rccStdOut.field_2._8_4_ != 0)) {
        std::__cxx11::string::operator=((string *)local_30,"rcc list process failed for:\n  ");
        cmQtAutoGen::Quoted(&local_150,(string *)files_local);
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::operator+=((string *)local_30,"\n");
        std::__cxx11::string::operator+=
                  ((string *)local_30,(string *)(rccStdErr.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_30,"\n");
        std::__cxx11::string::operator+=
                  ((string *)local_30,
                   (string *)
                   &cmd.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_30,"\n");
        this_local._7_1_ = 0;
        qrcContents.field_2._12_4_ = 1;
      }
      else {
        bVar1 = cmQtAutoGen::RccListParseOutput
                          ((string *)((long)&rccStdErr.field_2 + 8),
                           (string *)
                           &cmd.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)error_local,local_30);
        if (bVar1) {
          qrcContents.field_2._12_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          qrcContents.field_2._12_4_ = 1;
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(rccStdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)(fileNameName.field_2._M_local_buf + 8));
    }
    if (qrcContents.field_2._12_4_ == 0) {
      cmsys::SystemTools::GetFilenamePath(&local_558,(string *)files_local);
      cmQtAutoGen::RccListConvertFullPath
                (&local_558,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)error_local);
      std::__cxx11::string::~string((string *)&local_558);
      this_local._7_1_ = 1;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)local_30,"rcc resource file does not exist:\n  ");
    cmQtAutoGen::Quoted(&local_50,(string *)files_local);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::operator+=((string *)local_30,"\n");
    this_local._7_1_ = 0;
  }
LAB_00511bea:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::RccListInputs(std::string const& fileName,
                                           std::vector<std::string>& files,
                                           std::string& error)
{
  if (!cmSystemTools::FileExists(fileName)) {
    error = "rcc resource file does not exist:\n  ";
    error += Quoted(fileName);
    error += "\n";
    return false;
  }
  if (this->Rcc.ExecutableExists && !this->Rcc.ListOptions.empty()) {
    // Use rcc for file listing
    if (this->Rcc.Executable.empty()) {
      error = "rcc executable not available";
      return false;
    }

    // Run rcc list command in the directory of the qrc file with the
    // pathless
    // qrc file name argument. This way rcc prints relative paths.
    // This avoids issues on Windows when the qrc file is in a path that
    // contains non-ASCII characters.
    std::string const fileDir = cmSystemTools::GetFilenamePath(fileName);
    std::string const fileNameName = cmSystemTools::GetFilenameName(fileName);

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.push_back(this->Rcc.Executable);
      cmd.insert(cmd.end(), this->Rcc.ListOptions.begin(),
                 this->Rcc.ListOptions.end());
      cmd.push_back(fileNameName);
      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "rcc list process failed for:\n  ";
      error += Quoted(fileName);
      error += "\n";
      error += rccStdOut;
      error += "\n";
      error += rccStdErr;
      error += "\n";
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(fileName.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "rcc file not readable:\n  ";
          error += Quoted(fileName);
          error += "\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  RccListConvertFullPath(cmSystemTools::GetFilenamePath(fileName), files);
  return true;
}